

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

reference __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::operator()
          (span<int,_18446744073709551615UL> *this,size_type idx)

{
  bool bVar1;
  size_type sVar2;
  pointer piVar3;
  size_type idx_local;
  span<int,_18446744073709551615UL> *this_local;
  
  bVar1 = detail::is_positive<unsigned_long>(idx);
  if ((!bVar1) || (sVar2 = size(this), sVar2 <= idx)) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1251: Precondition violation."
              );
  }
  piVar3 = data(this);
  return piVar3 + idx;
}

Assistant:

reference operator()( size_type idx ) const
    {
        span_EXPECTS( detail::is_positive( idx ) && idx < size() );

        return *( data() + idx );
    }